

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O0

Float * __thiscall blc::math::Float::operator*(Float *this,double i)

{
  Float *in_RSI;
  Float *in_RDI;
  Float *in_XMM0_Qa;
  Float fl;
  Float *ret;
  Float *in_stack_ffffffffffffff98;
  Float *this_00;
  Float *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  Float(in_RSI);
  Float(this_00,(double)in_RDI);
  operator*(in_XMM0_Qa,in_stack_ffffffffffffffe0);
  operator=(in_RSI,in_stack_ffffffffffffff98);
  return this_00;
}

Assistant:

blc::math::Float blc::math::Float::operator*(double i) const {
	blc::math::Float ret;
	blc::math::Float fl(i);

	ret = *this * fl;
	return (ret);
}